

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_eat_terminator(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int yypos0;
  int yythunkpos0;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yymatchChar(G,0x3b);
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    uVar4 = yymatchChar(G,0);
    G->pos = iVar1;
    G->thunkpos = iVar2;
    uVar4 = uVar4 ^ 1;
  }
  else {
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar3 = yy_ws(G);
    } while (iVar3 != 0);
    G->pos = iVar1;
    G->thunkpos = iVar2;
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

YY_RULE(int) yy_eat_terminator(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "eat_terminator"));

  {  int yypos965= G->pos, yythunkpos965= G->thunkpos;  if (!yymatchChar(G, ';')) goto l966;
  if (!yy__(G))  goto l966;
  goto l965;
  l966:;	  G->pos= yypos965; G->thunkpos= yythunkpos965;  if (!yy_end_of_file(G))  goto l964;

  }
  l965:;	  yyprintf((stderr, "  ok   eat_terminator"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l964:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "eat_terminator"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}